

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O3

void __thiscall
JsrtDebugManager::ReportBreak(JsrtDebugManager *this,InterpreterHaltState *haltState)

{
  Utf8SourceInfo *pUVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  bool bVar3;
  FunctionBody *pFVar4;
  undefined4 *puVar5;
  undefined1 local_68 [8];
  JsrtDebugEventObject debugEventObject;
  
  if (this->debugEventCallback == (JsDiagDebugEventCallback)0x0) {
    return;
  }
  pFVar4 = Js::InterpreterHaltState::GetFunction(haltState);
  if (pFVar4 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                       ,0x100,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pUVar1 = (pFVar4->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  Js::InterpreterHaltState::GetCurrentOffset(haltState);
  scriptContext = (pUVar1->m_scriptContext).ptr;
  switch(haltState->stopType) {
  case STOP_INLINEBREAKPOINT:
    break;
  case STOP_STEPCOMPLETE:
    break;
  case STOP_EXCEPTIONTHROW:
    break;
  case STOP_ASYNCBREAK:
  }
  JsrtDebugEventObject::JsrtDebugEventObject((JsrtDebugEventObject *)local_68,scriptContext);
  JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)local_68);
  Js::ScriptContext::GetDebugContext(scriptContext);
}

Assistant:

void JsrtDebugManager::ReportBreak(Js::InterpreterHaltState* haltState)
{
    if (this->debugEventCallback != nullptr)
    {
        Js::FunctionBody* functionBody = haltState->GetFunction();
        Assert(functionBody != nullptr);

        Js::Utf8SourceInfo* utf8SourceInfo = functionBody->GetUtf8SourceInfo();
        int currentByteCodeOffset = haltState->GetCurrentOffset();
        Js::ScriptContext* scriptContext = utf8SourceInfo->GetScriptContext();

        JsDiagDebugEvent jsDiagDebugEvent = this->GetDebugEventFromStopType(haltState->stopType);

        JsrtDebugEventObject debugEventObject(scriptContext);

        Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();

        Js::ProbeContainer* probeContainer = scriptContext->GetDebugContext()->GetProbeContainer();

        if (jsDiagDebugEvent == JsDiagDebugEventBreakpoint)
        {
            UINT bpId = 0;
            probeContainer->MapProbesUntil([&](int i, Js::Probe* pProbe)
            {
                Js::BreakpointProbe* bp = (Js::BreakpointProbe*)pProbe;
                if (bp->Matches(functionBody, utf8SourceInfo->GetDebugDocument(), currentByteCodeOffset))
                {
                    bpId = bp->GetId();
                    return true;
                }
                return false;
            });

            AssertMsg(bpId != 0, "How come we don't have a breakpoint id for JsDiagDebugEventBreakpoint");

            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::breakpointId, bpId, scriptContext);
        }

        JsrtDebugUtils::AddScriptIdToObject(eventDataObject, utf8SourceInfo);
        JsrtDebugUtils::AddLineColumnToObject(eventDataObject, functionBody, currentByteCodeOffset);
        JsrtDebugUtils::AddSourceLengthAndTextToObject(eventDataObject, functionBody, currentByteCodeOffset);

        this->CallDebugEventCallbackForBreak(jsDiagDebugEvent, eventDataObject, scriptContext);
    }
}